

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineDeviceComputer.cxx
# Opt level: O2

bool __thiscall
cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag
          (cmLinkLineDeviceComputer *this,cmComputeLinkInformation *cli)

{
  Item *pIVar1;
  bool bVar2;
  ItemVector *pIVar3;
  __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
  __it;
  __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
  _Var4;
  long lVar5;
  long lVar6;
  long *local_110;
  undefined8 local_108;
  long local_100;
  undefined8 uStack_f8;
  long *local_f0;
  undefined8 local_e8;
  undefined1 local_e0;
  uint7 uStack_df;
  undefined8 uStack_d8;
  long *local_d0;
  undefined8 local_c8;
  long local_c0;
  undefined8 uStack_b8;
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string config;
  
  pIVar3 = cmComputeLinkInformation::GetItems(cli);
  std::__cxx11::string::string((string *)&config,(string *)&cli->Config);
  __it._M_current =
       (pIVar3->
       super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
       )._M_impl.super__Vector_impl_data._M_start;
  pIVar1 = (pIVar3->
           super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::string::string(local_b0,(string *)&config);
  std::__cxx11::string::string(local_90,local_b0);
  std::__cxx11::string::string(local_70,local_90);
  std::__cxx11::string::string((string *)&local_f0,local_70);
  local_c8 = local_e8;
  local_110 = &local_100;
  if (local_f0 == (long *)&local_e0) {
    uStack_f8 = uStack_d8;
    local_f0 = local_110;
  }
  local_e8 = 0;
  local_e0 = 0;
  local_d0 = local_f0;
  if (local_f0 == local_110) {
    uStack_b8 = uStack_f8;
    local_d0 = &local_c0;
  }
  local_108 = 0;
  local_100 = (ulong)uStack_df << 8;
  local_f0 = (long *)&local_e0;
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::string((string *)&local_110,(string *)&local_d0);
  lVar5 = (long)pIVar1 - (long)__it._M_current;
  for (lVar6 = lVar5 / 0x50 >> 2; 0 < lVar6; lVar6 = lVar6 + -1) {
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag(cmComputeLinkInformation&)::$_0>
            ::operator()((_Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag(cmComputeLinkInformation&)::__0>
                          *)&local_110,__it);
    _Var4._M_current = __it._M_current;
    if (bVar2) goto LAB_003cc90e;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag(cmComputeLinkInformation&)::$_0>
            ::operator()((_Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag(cmComputeLinkInformation&)::__0>
                          *)&local_110,__it._M_current + 1);
    _Var4._M_current = __it._M_current + 1;
    if (bVar2) goto LAB_003cc90e;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag(cmComputeLinkInformation&)::$_0>
            ::operator()((_Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag(cmComputeLinkInformation&)::__0>
                          *)&local_110,__it._M_current + 2);
    _Var4._M_current = __it._M_current + 2;
    if (bVar2) goto LAB_003cc90e;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag(cmComputeLinkInformation&)::$_0>
            ::operator()((_Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag(cmComputeLinkInformation&)::__0>
                          *)&local_110,__it._M_current + 3);
    _Var4._M_current = __it._M_current + 3;
    if (bVar2) goto LAB_003cc90e;
    __it._M_current = __it._M_current + 4;
    lVar5 = lVar5 + -0x140;
  }
  lVar5 = lVar5 / 0x50;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      _Var4._M_current = pIVar1;
      if ((lVar5 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag(cmComputeLinkInformation&)::$_0>
                  ::operator()((_Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag(cmComputeLinkInformation&)::__0>
                                *)&local_110,__it), _Var4._M_current = __it._M_current, bVar2))
      goto LAB_003cc90e;
      __it._M_current = __it._M_current + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag(cmComputeLinkInformation&)::$_0>
            ::operator()((_Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag(cmComputeLinkInformation&)::__0>
                          *)&local_110,__it);
    _Var4._M_current = __it._M_current;
    if (bVar2) goto LAB_003cc90e;
    __it._M_current = __it._M_current + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag(cmComputeLinkInformation&)::$_0>
          ::operator()((_Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag(cmComputeLinkInformation&)::__0>
                        *)&local_110,__it);
  _Var4._M_current = __it._M_current;
  if (!bVar2) {
    _Var4._M_current = pIVar1;
  }
LAB_003cc90e:
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string((string *)&config);
  return _Var4._M_current != pIVar1;
}

Assistant:

bool cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag(
  cmComputeLinkInformation& cli)
{
  // Determine if this item might requires device linking.
  // For this we only consider targets
  using ItemVector = cmComputeLinkInformation::ItemVector;
  ItemVector const& items = cli.GetItems();
  std::string config = cli.GetConfig();
  return std::any_of(
    items.begin(), items.end(),
    [config](cmComputeLinkInformation::Item const& item) -> bool {
      return item.Target &&
        item.Target->GetType() == cmStateEnums::STATIC_LIBRARY &&
        // this dependency requires us to device link it
        !item.Target->GetPropertyAsBool("CUDA_RESOLVE_DEVICE_SYMBOLS") &&
        item.Target->GetPropertyAsBool("CUDA_SEPARABLE_COMPILATION") &&
        item.Target->IsIPOEnabled("CUDA", config);
    });
}